

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall Clasp::ImpliedList::assign(ImpliedList *this,Solver *s)

{
  bool bVar1;
  uint32 uVar2;
  iterator pIVar3;
  Antecedent *pAVar4;
  Solver *in_RSI;
  pod_vector<Clasp::ImpliedLiteral,_std::allocator<Clasp::ImpliedLiteral>_> *in_RDI;
  iterator end;
  iterator it;
  iterator j;
  uint32 DL;
  bool ok;
  ImpliedLiteral *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar5;
  Solver *in_stack_ffffffffffffffa8;
  iterator in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffc0;
  iterator local_28;
  bool local_11;
  
  bVar1 = Solver::hasConflict((Solver *)0x1eb7c2);
  local_11 = (bool)((bVar1 ^ 0xffU) & 1);
  uVar2 = Solver::decisionLevel((Solver *)0x1eb7d4);
  local_28 = bk_lib::pod_vector<Clasp::ImpliedLiteral,_std::allocator<Clasp::ImpliedLiteral>_>::
             begin(in_RDI);
  local_28 = local_28 + *(uint *)((long)&in_RDI[1].ebo_.buf + 4);
  pIVar3 = bk_lib::pod_vector<Clasp::ImpliedLiteral,_std::allocator<Clasp::ImpliedLiteral>_>::end
                     (in_RDI);
  do {
    if (local_28 == pIVar3) {
      bk_lib::pod_vector<Clasp::ImpliedLiteral,_std::allocator<Clasp::ImpliedLiteral>_>::end(in_RDI)
      ;
      bk_lib::pod_vector<Clasp::ImpliedLiteral,_std::allocator<Clasp::ImpliedLiteral>_>::erase
                ((pod_vector<Clasp::ImpliedLiteral,_std::allocator<Clasp::ImpliedLiteral>_> *)
                 in_stack_ffffffffffffffb0,(iterator)in_stack_ffffffffffffffa8,
                 (iterator)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      bVar1 = bk_lib::pod_vector<Clasp::ImpliedLiteral,_std::allocator<Clasp::ImpliedLiteral>_>::
              empty(in_RDI);
      *(uint32 *)&in_RDI[1].ebo_.buf = uVar2 * ((bVar1 ^ 0xffU) & 1);
      uVar5 = *(uint *)&in_RDI[1].ebo_.buf;
      uVar2 = Solver::rootLevel(in_RSI);
      if (uVar2 < uVar5) {
        uVar2 = *(uint32 *)((long)&in_RDI[1].ebo_.buf + 4);
      }
      else {
        uVar2 = sizeVec<bk_lib::pod_vector<Clasp::ImpliedLiteral,std::allocator<Clasp::ImpliedLiteral>>>
                          ((pod_vector<Clasp::ImpliedLiteral,_std::allocator<Clasp::ImpliedLiteral>_>
                            *)0x1eb973);
      }
      *(uint32 *)((long)&in_RDI[1].ebo_.buf + 4) = uVar2;
      return local_11;
    }
    if (local_28->level <= uVar2) {
      bVar1 = local_11 != false;
      local_11 = false;
      if (bVar1) {
        in_stack_ffffffffffffffa8 = in_RSI;
        in_stack_ffffffffffffffb0 = local_28;
        pAVar4 = ReasonStore64::value_type::ante(&local_28->ante);
        ReasonStore64::value_type::data(&local_28->ante);
        local_11 = Solver::force((Solver *)CONCAT17(local_11,in_stack_ffffffffffffffc0),
                                 (Literal *)pAVar4,(Antecedent *)in_stack_ffffffffffffffb0,
                                 (uint32)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      }
      if (uVar2 <= local_28->level) {
        pAVar4 = ReasonStore64::value_type::ante(&local_28->ante);
        bVar1 = Antecedent::isNull(pAVar4);
        if (!bVar1) goto LAB_001eb8d9;
      }
      ImpliedLiteral::operator=
                ((ImpliedLiteral *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88);
    }
LAB_001eb8d9:
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

bool ImpliedList::assign(Solver& s) {
	assert(front <= lits.size());
	bool ok             = !s.hasConflict();
	const uint32 DL     = s.decisionLevel();
	VecType::iterator j = lits.begin() + front;
	for (VecType::iterator it = j, end = lits.end(); it != end; ++it) {
		if(it->level <= DL) {
			ok = ok && s.force(it->lit, it->ante.ante(), it->ante.data());
			if (it->level < DL || it->ante.ante().isNull()) { *j++ = *it; }
		}
	}
	lits.erase(j, lits.end());
	level = DL * uint32(!lits.empty());
	front = level > s.rootLevel() ? front  : sizeVec(lits);
	return ok;
}